

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-wear.c
# Opt level: O3

_Bool borg_wear_stuff(void)

{
  ushort uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  int iVar9;
  wchar_t wVar10;
  uint32_t uVar11;
  int32_t iVar12;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  borg_item_conflict *pbVar17;
  long lVar18;
  bool bVar19;
  uint uVar20;
  borg_item *item;
  bool bVar21;
  bool bVar22;
  char target_ring_desc [80];
  uint local_a4;
  char local_88 [88];
  
  iVar3 = borg.power;
  if (((borg.trait[0x6d] == 0) && (borg.trait[0x6c] == 0)) &&
     (wVar6 = borg_first_empty_inventory_slot(), wVar6 != L'\xffffffff')) {
    if (2000 < borg_t - borg_began) {
      return false;
    }
    if (0x514 < borg.time_this_panel) {
      return false;
    }
    if (z_info->pack_size != 0) {
      local_a4 = 0xffffffff;
      bVar5 = false;
      uVar16 = 0;
      uVar20 = 0xffffffff;
      do {
        if ((((borg_items[uVar16].iqty != '\0') &&
             (item = (borg_item *)(borg_items + uVar16), item->aware == true)) && (item->value != 0)
            ) && ((((player->opts).opt[0x1e] != true || (item->art_idx == '\0')) ||
                  (item->ident == true)))) {
          if (0 < (long)track_worn_num) {
            lVar18 = 0;
            bVar21 = false;
            do {
              bVar19 = bVar21;
              bVar2 = borg_t + -10 < (int)track_worn_time;
              bVar22 = track_worn_name1[lVar18] == item->art_idx;
              lVar18 = lVar18 + 1;
              bVar21 = (bool)(bVar19 | (bVar22 && bVar2));
            } while (track_worn_num != lVar18);
            if (bVar19 || bVar22 && bVar2) {
              pcVar13 = format("# Not considering a %s; it was recently worn.",item);
              borg_note(pcVar13);
              goto LAB_0022e87c;
            }
          }
          wVar7 = borg_wield_slot(item);
          if ((L'\xffffffff' < wVar7) &&
             ((borg.trait[0x7a] == 0 || (borg_items[(uint)wVar7].modifiers[0] <= item->modifiers[0])
              ))) {
            wVar8 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false);
            if ((wVar7 != (uint)z_info->pack_size + L'\x03') ||
               ((borg_items[(uint)wVar7].iqty == '\0' ||
                (uVar4 = uVar20, iVar9 = iVar3,
                borg_items[(ulong)z_info->pack_size + 2].iqty == '\0')))) {
              memcpy(borg_items + wVar6,safe_items + (uint)wVar7,0x388);
              memcpy(borg_items + (uint)wVar7,safe_items + uVar16,0x388);
              pbVar17 = borg_items;
              borg_items[(uint)wVar7].iqty = '\x01';
              pbVar17[uVar16].iqty = pbVar17[uVar16].iqty + 0xff;
              borg_notice(true);
              iVar9 = borg_power();
              wVar10 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false);
              memcpy(borg_items + (uint)wVar7,safe_items + (uint)wVar7,0x388);
              memcpy(borg_items + uVar16,safe_items + uVar16,0x388);
              pbVar17 = borg_items;
              borg_items[wVar6].iqty = '\0';
              if ((item->one_ring == true) && (pbVar17[(ulong)z_info->pack_size + 3].tval == '\0'))
              {
                iVar9 = -99999;
              }
              bVar5 = true;
              if ((wVar8 < wVar10) || (uVar4 = (uint)uVar16, iVar9 <= iVar3 + 0x32))
              goto LAB_0022e87c;
            }
            uVar20 = uVar4;
            uVar11 = Rand_div(100);
            iVar3 = iVar9;
            if ((uVar11 == 10) || (item->one_ring == true)) {
              uVar1 = z_info->pack_size;
              if (((wVar7 == (uint)uVar1 + L'\x03') && (borg_items[(uint)wVar7].iqty != '\0')) &&
                 (borg_items[(ulong)uVar1 + 2].iqty != '\0')) {
                lVar18 = (ulong)uVar1 * 0x388;
                uVar15 = (ulong)uVar1 + 2;
                pbVar17 = borg_items;
                do {
                  memcpy(pbVar17 + wVar6,safe_items[2].desc + lVar18,0x388);
                  memcpy(borg_items[2].desc + lVar18,safe_items + uVar16,0x388);
                  pbVar17 = borg_items;
                  borg_items[2].curses[lVar18 + -0x26] = true;
                  pbVar17[uVar16].iqty = pbVar17[uVar16].iqty + 0xff;
                  borg_notice(true);
                  iVar12 = borg_power();
                  wVar7 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false);
                  memcpy(borg_items[2].desc + lVar18,safe_items[2].desc + lVar18,0x388);
                  memcpy(borg_items + uVar16,safe_items + uVar16,0x388);
                  pbVar17 = borg_items;
                  borg_items[wVar6].iqty = '\0';
                  uVar14 = (ulong)z_info->pack_size + 3;
                  if ((uVar15 == uVar14) && (item->one_ring != false)) {
                    iVar12 = -99999;
                  }
                  if ((wVar7 < wVar8 || wVar8 == L'\0') && iVar9 <= iVar12) {
                    local_a4 = (uint)uVar15;
                    uVar20 = (uint)uVar16;
                    iVar9 = iVar12;
                  }
                  lVar18 = lVar18 + 0x388;
                  bVar5 = true;
                  bVar21 = uVar15 < uVar14;
                  uVar15 = uVar15 + 1;
                  iVar3 = iVar9;
                } while (bVar21);
              }
            }
          }
        }
LAB_0022e87c:
        uVar16 = uVar16 + 1;
        if (z_info->pack_size <= uVar16) {
          if (bVar5) {
            borg_notice(true);
          }
          if ((int)uVar20 < 0) {
            return false;
          }
          if (iVar3 <= borg.power) {
            return false;
          }
          pbVar17 = borg_items + uVar20;
          my_strcpy(local_88,pbVar17->desc,0x50);
          if (((int)(z_info->pack_size + 2) <= (int)local_a4) && (pbVar17->tval == '\x15')) {
            pcVar13 = format("# Removing %s to make room for %s.",borg_items + local_a4,pbVar17);
            borg_note(pcVar13);
            borg_keypress(0x74);
            borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"
                               [(long)(int)local_a4 - (ulong)z_info->pack_size]);
            borg.time_this_panel = borg.time_this_panel + 1;
            return true;
          }
          pcVar13 = format("# Wearing %s.",pbVar17);
          borg_note(pcVar13);
          borg_keypress(0x77);
          borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[uVar20]);
          borg.time_this_panel = borg.time_this_panel + 1;
          if (pbVar17->art_idx == '\0') {
            return true;
          }
          if (track_worn_size <= track_worn_num) {
            return true;
          }
          borg_note("# Noting the wearing of artifact.");
          track_worn_name1[track_worn_num] = pbVar17->art_idx;
          track_worn_num = track_worn_num + 1;
          track_worn_time = borg_t;
          return true;
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

bool borg_wear_stuff(void)
{
    int hole = 0;

    int  slot;
    int  d;
    int  o;
    bool recently_worn = false;

    int32_t p, b_p = 0L;

    int i, b_i     = -1;
    int ii, b_ii   = -1;
    int danger;

    char target_ring_desc[80];

    borg_item *item;

    bool fix = false;

    /* Start with current power */
    b_p = borg.power;

    /*  hack to prevent the swap till you drop loop */
    if (borg.trait[BI_ISHUNGRY] || borg.trait[BI_ISWEAK])
        return false;

    /* We need an empty slot to simulate pushing equipment */
    hole = borg_first_empty_inventory_slot();
    if (hole == -1)
        return false;

    /* Forbid if been sitting on level forever */
    /*    Just come back and work through the loop later */
    if (borg_t - borg_began > 2000)
        return false;
    if (borg.time_this_panel > 1300)
        return false;

    /* Scan inventory */
    for (i = 0; i < z_info->pack_size; i++) {
        item = &borg_items[i];

        /* reset this item marker */
        recently_worn = false;

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Require aware */
        if (!item->aware)
            continue;

        /* Hack -- ignore "worthless" items */
        if (!item->value)
            continue;

        /* do not wear not *idd* artifacts */
        if (OPT(player, birth_randarts) && item->art_idx && !item->ident)
            continue;

        /* Do not consider wearing this item if I worn it already this level,
         * I might be stuck in a loop.
         */
        for (o = 0; o < track_worn_num; o++) {
            /* Examine the worn list */
            if (track_worn_num >= 1 && track_worn_name1[o] == item->art_idx
                && track_worn_time > borg_t - 10) {
                /* Recently worn item */
                recently_worn = true;
            }
        }

        /* Note and fail out */
        if (recently_worn == true) {
            borg_note(format(
                "# Not considering a %s; it was recently worn.", item->desc));
            continue;
        }

        /* Where does it go */
        slot = borg_wield_slot(item);

        /* Cannot wear this item */
        if (slot < 0)
            continue;

        /* Do not wear certain items if I am over weight limit.  It induces
         * loops */
        if (borg.trait[BI_ISENCUMB]) {
            /* Compare Str bonuses */
            if (borg_items[slot].modifiers[OBJ_MOD_STR]
                > item->modifiers[OBJ_MOD_STR])
                continue;
        }

        /* Obtain danger */
        danger = borg_danger(borg.c.y, borg.c.x, 1, true, false);

        /* If this is a ring and both hands are full, then check each hand
         * and compare the two.  If needed the tight ring can be removed then
         * the better ring placed there on.
         */

        /*** Process regular items and non full rings ***/

        /* Non ring, non full hands */
        if (slot != INVEN_LEFT
            || (!borg_items[INVEN_LEFT].iqty
                || !borg_items[INVEN_RIGHT].iqty)) {
            /* Take off old item */
            memcpy(&borg_items[hole], &safe_items[slot], sizeof(borg_item));

            /* Wear new item */
            memcpy(&borg_items[slot], &safe_items[i], sizeof(borg_item));

            /* Only a single item */
            borg_items[slot].iqty = 1;

            /* Reduce the inventory quantity by one */
            borg_items[i].iqty--;

            /* Fix later */
            fix = true;

            /* Examine the inventory */
            borg_notice(true);

            /* Evaluate the inventory */
            p = borg_power();

            /* Evaluate local danger */
            d = borg_danger(borg.c.y, borg.c.x, 1, true, false);

#if 0
            if (borg_cfg[BORG_VERBOSE]) {
                /* dump list and power...  for debugging */
                borg_note(format("Trying  Item %s (best power %ld)",
                    borg_items[slot].desc, (long int)p));
                borg_note(format("Against Item %s (borg_power %ld)",
                    safe_items[slot].desc, (long int)b_p));
            }
#endif

            /* Restore the old item */
            memcpy(&borg_items[slot], &safe_items[slot], sizeof(borg_item));

            /* Restore the new item */
            memcpy(&borg_items[i], &safe_items[i], sizeof(borg_item));

            /* Restore the hole */
            borg_items[hole].iqty = 0;

            /* Need to be careful not to put the One Ring onto
             * the Left Hand
             */
            if (item->one_ring && !borg_items[INVEN_LEFT].tval)
                p = -99999;

            /* Ignore if more dangerous */
            if (danger < d)
                continue;

            /* XXX XXX XXX Consider if slot is empty */

            /* Hack -- Ignore "essentially equal" swaps */
            if (p <= b_p + 50)
                continue;

            /* Maintain the "best" */
            b_i = i;
            b_p = p;
        } /* non-rings, non full */

        if (randint0(100) == 10 || item->one_ring) {
            /* ring, full hands */
            if (slot == INVEN_LEFT && borg_items[INVEN_LEFT].iqty
                && borg_items[INVEN_RIGHT].iqty) {
                for (ii = INVEN_RIGHT; ii <= INVEN_LEFT; ii++) {
                    slot = ii;

                    /* Does One Ring need to be handled here? */

                    /* Take off old item */
                    memcpy(&borg_items[hole], &safe_items[slot],
                        sizeof(borg_item));

                    /* Wear new item */
                    memcpy(
                        &borg_items[slot], &safe_items[i], sizeof(borg_item));

                    /* Only a single item */
                    borg_items[slot].iqty = 1;

                    /* Reduce the inventory quantity by one */
                    borg_items[i].iqty--;

                    /* Fix later */
                    fix = true;

                    /* Examine the inventory */
                    borg_notice(true);

                    /* Evaluate the inventory */
                    p = borg_power();

                    /* Evaluate local danger */
                    d = borg_danger(borg.c.y, borg.c.x, 1, true, false);

                    /* Restore the old item */
                    memcpy(&borg_items[slot], &safe_items[slot],
                        sizeof(borg_item));

                    /* Restore the new item */
                    memcpy(&borg_items[i], &safe_items[i], sizeof(borg_item));

                    /* Restore the hole */
                    borg_items[hole].iqty = 0;

                    /* Need to be careful not to put the One Ring onto
                     * the Left Hand
                     */
                    if (ii == INVEN_LEFT && item->one_ring)
                        p = -99999;

                    /* Ignore "bad" swaps */
                    if (p < b_p)
                        continue;

                    /* no swapping into more danger */
                    if (danger <= d && danger != 0)
                        continue;

                    /* Maintain the "best" */
                    b_i  = i;
                    b_p  = p;
                    b_ii = ii;
                }
            } /* ring, looking at replacing each ring */
        } /* Random ring check */

    } /* end scanning inventory */

    /* Restore bonuses */
    if (fix)
        borg_notice(true);

    /* item */
    if ((b_i >= 0) && (b_p > borg.power)) {
        /* Get the item */
        item = &borg_items[b_i];

        /* Define the desc of the nice ring */
        my_strcpy(target_ring_desc, item->desc, sizeof(target_ring_desc));

        /* Remove old ring to make room for good one */
        if (b_ii >= INVEN_RIGHT && item->tval == TV_RING) {
            /* Log */
            borg_note(format("# Removing %s to make room for %s.",
                borg_items[b_ii].desc, item->desc));

            /* Make room */
            borg_keypress('t');
            borg_keypress(all_letters_nohjkl[b_ii - INVEN_WIELD]);

            /* Did something */
            borg.time_this_panel++;
            return true;
        }

        /* Log */
        borg_note(format("# Wearing %s.", item->desc));

        /* Wear it */
        borg_keypress('w');
        borg_keypress(all_letters_nohjkl[b_i]);
        borg.time_this_panel++;

        /* Track the newly worn artifact item to avoid loops */
        if (item->art_idx && (track_worn_num < track_worn_size)) {
            borg_note("# Noting the wearing of artifact.");
            track_worn_name1[track_worn_num] = item->art_idx;
            track_worn_time                  = borg_t;
            track_worn_num++;
        }
        return true;
    }

    /* Nope */
    return false;
}